

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

either * toml::detail::syntax::simple_key(spec *s)

{
  either *in_RDI;
  spec *in_stack_00000068;
  either *in_stack_ffffffffffffffb0;
  repeat_at_least *in_stack_ffffffffffffffb8;
  either *in_stack_ffffffffffffffc0;
  either *s_00;
  
  s_00 = in_RDI;
  unquoted_key(in_stack_00000068);
  quoted_key((spec *)s_00);
  either::either<toml::detail::repeat_at_least,toml::detail::either>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  either::~either(in_RDI);
  repeat_at_least::~repeat_at_least((repeat_at_least *)in_RDI);
  return in_RDI;
}

Assistant:

TOML11_INLINE either simple_key(const spec& s)
{
    return either(unquoted_key(s), quoted_key(s));
}